

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O0

void __thiscall
anaPlanner::DeleteSearchStateSpace(anaPlanner *this,anaSearchStateSpace_t *pSearchStateSpace)

{
  void *pvVar1;
  size_type sVar2;
  reference ppCVar3;
  long in_RSI;
  anaPlanner *in_RDI;
  CHeap *unaff_retaddr;
  CMDPSTATE *state;
  int i;
  int iend;
  value_type in_stack_ffffffffffffffe0;
  int local_18;
  
  if (*(long *)(in_RSI + 0x18) != 0) {
    CHeap::makeemptyheap(*(CHeap **)(in_RSI + 0x18));
    pvVar1 = *(void **)(in_RSI + 0x18);
    if (pvVar1 != (void *)0x0) {
      CHeap::~CHeap(unaff_retaddr);
      operator_delete(pvVar1,0x18);
    }
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  sVar2 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::size
                    ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RSI + 0x38));
  for (local_18 = 0; local_18 < (int)sVar2; local_18 = local_18 + 1) {
    ppCVar3 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        ((vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RSI + 0x38),
                         (long)local_18);
    in_stack_ffffffffffffffe0 = *ppCVar3;
    if ((in_stack_ffffffffffffffe0 != (value_type)0x0) &&
       (in_stack_ffffffffffffffe0->PlannerSpecificData != (void *)0x0)) {
      DeleteSearchStateData(in_RDI,(anaState *)in_stack_ffffffffffffffe0->PlannerSpecificData);
      free(in_stack_ffffffffffffffe0->PlannerSpecificData);
      in_stack_ffffffffffffffe0->PlannerSpecificData = (void *)0x0;
    }
  }
  CMDP::Delete((CMDP *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void anaPlanner::DeleteSearchStateSpace(anaSearchStateSpace_t* pSearchStateSpace)
{
    if (pSearchStateSpace->heap != NULL) {
        pSearchStateSpace->heap->makeemptyheap();
        delete pSearchStateSpace->heap;
        pSearchStateSpace->heap = NULL;
    }

    /*
    if(pSearchStateSpace->inconslist != NULL)
    {
        pSearchStateSpace->inconslist->makeemptyheap();
        delete pSearchStateSpace->inconslist;
        pSearchStateSpace->inconslist = NULL;
    }
    */

    //delete the states themselves
    int iend = (int)pSearchStateSpace->searchMDP.StateArray.size();
    for (int i = 0; i < iend; i++) {
        CMDPSTATE* state = pSearchStateSpace->searchMDP.StateArray[i];
        if (state != NULL && state->PlannerSpecificData != NULL) {
            DeleteSearchStateData((anaState*)state->PlannerSpecificData);
            free((anaState*)state->PlannerSpecificData);
            state->PlannerSpecificData = NULL;
        }
    }
    pSearchStateSpace->searchMDP.Delete();
}